

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

string __thiscall cs_impl::any::holder<cs::type_id>::to_string_abi_cxx11_(holder<cs::type_id> *this)

{
  proxy *in_RDI;
  type_id *in_stack_00000068;
  
  to_string<cs::type_id>(in_stack_00000068);
  return (string)in_RDI;
}

Assistant:

std::string to_string() const override
			{
				return cs_impl::to_string(mDat);
			}